

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamMultiReader_p.cpp
# Opt level: O0

void __thiscall
BamTools::Internal::BamMultiReaderPrivate::SetErrorString
          (BamMultiReaderPrivate *this,string *where,string *what)

{
  int iVar1;
  RuleToken *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  string local_70 [16];
  RuleToken *in_stack_ffffffffffffffa0;
  RuleToken *in_stack_ffffffffffffffa8;
  string local_50 [55];
  
  if (SetErrorString(std::__cxx11::string_const&,std::__cxx11::string_const&)::SEPARATOR_abi_cxx11_
      == '\0') {
    iVar1 = __cxa_guard_acquire(&SetErrorString(std::__cxx11::string_const&,std::__cxx11::string_const&)
                                 ::SEPARATOR_abi_cxx11_);
    if (iVar1 != 0) {
      in_stack_ffffffffffffff80 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &stack0xffffffffffffffe7;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)
                 &SetErrorString(std::__cxx11::string_const&,std::__cxx11::string_const&)::
                  SEPARATOR_abi_cxx11_,": ",(allocator *)in_stack_ffffffffffffff80);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe7);
      __cxa_atexit(std::__cxx11::string::~string,
                   &SetErrorString(std::__cxx11::string_const&,std::__cxx11::string_const&)::
                    SEPARATOR_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&SetErrorString(std::__cxx11::string_const&,std::__cxx11::string_const&)::
                           SEPARATOR_abi_cxx11_);
    }
  }
  std::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  std::operator+(in_RDI,in_stack_ffffffffffffff80);
  std::__cxx11::string::operator=((string *)(in_RDI + 1),local_50);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_70);
  return;
}

Assistant:

void BamMultiReaderPrivate::SetErrorString(const std::string& where, const std::string& what) const
{
    static const std::string SEPARATOR(": ");
    m_errorString = where + SEPARATOR + what;
}